

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O2

bool __thiscall spvtools::opt::InlinePass::HasNoReturnInLoop(InlinePass *this,Function *func)

{
  pointer puVar1;
  BasicBlock *this_00;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  FeatureManager *pFVar5;
  StructuredCFGAnalysis *this_01;
  pointer puVar6;
  
  pFVar5 = IRContext::get_feature_mgr((this->super_Pass).context_);
  bVar2 = EnumSet<spv::Capability>::contains(&pFVar5->capabilities_,Shader);
  if (bVar2) {
    this_01 = IRContext::GetStructuredCFGAnalysis((this->super_Pass).context_);
    puVar1 = (func->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar6 = (func->blocks_).
                  super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; bVar2 = puVar6 == puVar1, !bVar2;
        puVar6 = puVar6 + 1) {
      this_00 = (puVar6->_M_t).
                super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      bVar3 = spvOpcodeIsReturn((*(Instruction **)
                                  ((long)&(this_00->insts_).
                                          super_IntrusiveList<spvtools::opt::Instruction> + 0x18))->
                                opcode_);
      if (bVar3) {
        uVar4 = BasicBlock::id(this_00);
        uVar4 = StructuredCFGAnalysis::ContainingLoop(this_01,uVar4);
        if (uVar4 != 0) {
          return bVar2;
        }
      }
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool InlinePass::HasNoReturnInLoop(Function* func) {
  // If control not structured, do not do loop/return analysis
  // TODO: Analyze returns in non-structured control flow
  if (!context()->get_feature_mgr()->HasCapability(spv::Capability::Shader))
    return false;
  const auto structured_analysis = context()->GetStructuredCFGAnalysis();
  // Search for returns in structured construct.
  bool return_in_loop = false;
  for (auto& blk : *func) {
    auto terminal_ii = blk.cend();
    --terminal_ii;
    if (spvOpcodeIsReturn(terminal_ii->opcode()) &&
        structured_analysis->ContainingLoop(blk.id()) != 0) {
      return_in_loop = true;
      break;
    }
  }
  return !return_in_loop;
}